

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O0

int __thiscall jrtplib::RTPAbortDescriptors::ClearAbortSignal(RTPAbortDescriptors *this)

{
  RTPTime RStack_28;
  int status_1;
  int local_20;
  int8_t local_1a;
  byte local_19;
  int status;
  int8_t isset;
  bool done;
  RTPAbortDescriptors *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xae;
  }
  else {
    local_19 = 0;
    _status = this;
    do {
      while( true ) {
        if (((local_19 ^ 0xff) & 1) == 0) {
          return 0;
        }
        local_1a = '\0';
        RTPTime::RTPTime(&stack0xffffffffffffffd8,0.0);
        local_20 = RTPSelect(this->m_descriptors,&local_1a,1,RStack_28);
        if (local_20 < 0) {
          return local_20;
        }
        if (local_1a != '\0') break;
        local_19 = 1;
      }
      this_local._4_4_ = ReadSignallingByte(this);
    } while (-1 < this_local._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

int RTPAbortDescriptors::ClearAbortSignal()
{
	if (!m_init)
		return ERR_RTP_ABORTDESC_NOTINIT;

	bool done = false;
	while (!done)
	{
		int8_t isset = 0;

		// Not used: struct timeval tv = { 0, 0 };

		int status = RTPSelect(&m_descriptors[0], &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (!isset)
			done = true;
		else
		{
			int status = ReadSignallingByte();
			if (status < 0)
				return status;
		}
	}

	return 0;
}